

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StereoMatching.hpp
# Opt level: O1

Mat * ncc(Mat *in1,Mat *in2,string *type,bool add_constant)

{
  long lVar1;
  double *pdVar2;
  uint uVar3;
  uint uVar4;
  pointer pdVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  _InputArray *p_Var11;
  undefined7 in_register_00000009;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  char in_R8B;
  long lVar18;
  long lVar19;
  uint uVar20;
  size_type __n;
  uint uVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  undefined1 auStack_288 [8];
  Mat depth;
  pointer local_278;
  long *local_240;
  Mat local_220 [8];
  Mat left;
  long local_210;
  long *local_1d8;
  Mat local_1c0 [8];
  Mat right;
  long local_1b0;
  long *local_178;
  _InputArray local_160;
  long local_148;
  undefined1 local_140 [8];
  vector<double,_std::allocator<double>_> tmp;
  long *local_f8;
  pointer pvStack_a8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  max_ncc;
  uint local_54;
  ulong local_48;
  allocator_type local_35;
  int local_34;
  
  pcVar12 = (char *)CONCAT71(in_register_00000009,add_constant);
  uVar3 = **(uint **)(in2 + 0x40);
  uVar13 = (ulong)uVar3;
  uVar4 = (*(uint **)(in2 + 0x40))[1];
  bgr_to_grey(local_220);
  bgr_to_grey(local_1c0);
  if (in_R8B != '\0') {
    max_ncc.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_288;
    auStack_288 = (undefined1  [8])0x4024000000000000;
    _depth = (pointer)0x0;
    local_278 = (pointer)0x0;
    tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_140._0_4_ = 0x1010000;
    local_160.obj = local_1c0;
    pvStack_a8 = (pointer)CONCAT44(pvStack_a8._4_4_,-0x3efdfffa);
    max_ncc.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x400000001;
    local_160.sz.width = 0;
    local_160.sz.height = 0;
    local_160.flags = -0x3dff0000;
    tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)local_160.obj;
    p_Var11 = (_InputArray *)cv::noArray();
    cv::add((_InputArray *)local_140,(_InputArray *)&pvStack_a8,(_OutputArray *)&local_160,p_Var11,
            -1);
  }
  cv::Mat::Mat((Mat *)auStack_288,uVar3,uVar4,0);
  __n = (size_type)(int)uVar4;
  pvStack_a8 = (pointer)0x0;
  max_ncc.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  max_ncc.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (0 < (int)uVar3) {
    uVar14 = uVar13;
    do {
      local_160.flags = 0;
      local_160._4_4_ = 0xc0000000;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)local_140,__n,
                 (value_type_conflict2 *)&local_160,&local_35);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&pvStack_a8,(vector<double,_std::allocator<double>_> *)local_140);
      if ((void *)CONCAT44(local_140._4_4_,local_140._0_4_) != (void *)0x0) {
        operator_delete((void *)CONCAT44(local_140._4_4_,local_140._0_4_));
      }
      uVar21 = (int)uVar14 - 1;
      uVar14 = (ulong)uVar21;
    } while (uVar21 != 0);
  }
  uVar8 = uVar4 - 1;
  local_148 = -(ulong)uVar4;
  lVar23 = 1;
  local_54 = uVar4;
  uVar21 = uVar8;
  do {
    local_48 = (ulong)uVar21;
    cv::Mat::Mat((Mat *)local_140,uVar3,uVar4,0);
    local_54 = local_54 - 1;
    iVar9 = std::__cxx11::string::compare(pcVar12);
    if (iVar9 == 0) {
      if (0 < (int)uVar3) {
        uVar14 = 0;
        do {
          lVar16 = 0;
          do {
            *(undefined1 *)
             ((long)tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish + lVar16 + *local_f8 * uVar14) =
                 *(undefined1 *)(lVar16 + *local_178 * uVar14 + local_1b0);
            lVar16 = lVar16 + 1;
          } while (lVar23 != lVar16);
          if (lVar23 < (long)__n) {
            lVar16 = 0;
            do {
              *(undefined1 *)
               ((long)tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish + lVar16 + lVar23 + *local_f8 * uVar14) =
                   *(undefined1 *)(lVar16 + *local_178 * uVar14 + local_1b0);
              lVar16 = lVar16 + 1;
            } while (local_148 + lVar23 + lVar16 != 0);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar13);
      }
    }
    else {
      iVar9 = std::__cxx11::string::compare(pcVar12);
      if (iVar9 != 0) {
        cv::Mat::Mat(in1,0,0,0);
        cv::Mat::~Mat((Mat *)local_140);
        goto LAB_00104789;
      }
      if (0 < (int)uVar3) {
        uVar14 = 0;
        do {
          lVar16 = (long)(int)local_54;
          if (lVar23 < (long)__n) {
            uVar15 = 0;
            do {
              *(undefined1 *)
               ((long)tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish + uVar15 + *local_f8 * uVar14) =
                   *(undefined1 *)(uVar15 + *local_1d8 * uVar14 + local_210 + lVar23);
              uVar15 = uVar15 + 1;
            } while (local_48 != uVar15);
          }
          do {
            *(undefined1 *)
             ((long)tmp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish + lVar16 + *local_f8 * uVar14) =
                 *(undefined1 *)(lVar16 + *local_1d8 * uVar14 + local_210);
            lVar16 = lVar16 + 1;
          } while (lVar16 < (long)__n);
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar13);
      }
    }
    if (0 < (int)uVar3) {
      uVar14 = 0;
      do {
        iVar9 = (int)uVar14;
        uVar15 = 3;
        if (3 < iVar9) {
          uVar15 = uVar14 & 0xffffffff;
        }
        if (0 < (int)uVar4) {
          lVar16 = uVar15 - 3;
          local_34 = 3;
          if (3 < iVar9) {
            local_34 = iVar9;
          }
          local_34 = local_34 + -3;
          iVar7 = iVar9 + 3;
          if ((int)(uVar3 - 1) <= iVar9 + 3) {
            iVar7 = uVar3 - 1;
          }
          iVar9 = iVar7 - local_34;
          lVar17 = (long)iVar7;
          uVar15 = 0;
          do {
            uVar24 = 3;
            if (3 < (int)uVar15) {
              uVar24 = uVar15 & 0xffffffff;
            }
            lVar1 = uVar24 - 4;
            iVar22 = (int)uVar24 + -3;
            uVar20 = (int)uVar15 + 3;
            if ((int)uVar8 <= (int)uVar20) {
              uVar20 = uVar8;
            }
            dVar26 = (double)(int)((uVar20 - iVar22) * iVar9);
            iVar10 = std::__cxx11::string::compare(pcVar12);
            dVar31 = 0.0;
            if (iVar10 == 0) {
              dVar27 = 0.0;
              dVar25 = 0.0;
              if (local_34 <= iVar7) {
                lVar18 = lVar16;
                do {
                  if (iVar22 <= (int)uVar20) {
                    lVar19 = lVar1;
                    do {
                      dVar27 = dVar27 + (double)*(byte *)(*local_1d8 * lVar18 + local_210 + 1 +
                                                         lVar19);
                      dVar25 = dVar25 + (double)*(byte *)((long)tmp.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish +
                                                  lVar19 + *local_f8 * lVar18 + 1);
                      lVar19 = lVar19 + 1;
                    } while (lVar19 < (int)uVar20);
                  }
                  bVar6 = lVar18 < lVar17;
                  lVar18 = lVar18 + 1;
                } while (bVar6);
              }
              dVar28 = 0.0;
              dVar32 = 0.0;
              if (local_34 <= iVar7) {
                dVar31 = 0.0;
                lVar18 = lVar16;
                dVar28 = 0.0;
                do {
                  if (iVar22 <= (int)uVar20) {
                    lVar19 = lVar1;
                    do {
                      dVar29 = (double)*(byte *)(*local_1d8 * lVar18 + local_210 + 1 + lVar19) -
                               dVar27 / dVar26;
                      dVar28 = dVar28 + dVar29 * dVar29;
                      dVar30 = (double)*(byte *)((long)tmp.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish +
                                                lVar19 + *local_f8 * lVar18 + 1) - dVar25 / dVar26;
                      dVar32 = dVar32 + dVar30 * dVar30;
                      dVar31 = dVar31 + dVar29 * dVar30;
                      lVar19 = lVar19 + 1;
                    } while (lVar19 < (int)uVar20);
                  }
                  bVar6 = lVar18 < lVar17;
                  lVar18 = lVar18 + 1;
                } while (bVar6);
              }
            }
            else {
              dVar27 = 0.0;
              dVar25 = 0.0;
              lVar18 = lVar16;
              if (local_34 <= iVar7) {
                do {
                  if (iVar22 <= (int)uVar20) {
                    lVar19 = lVar1;
                    do {
                      dVar27 = dVar27 + (double)*(byte *)((long)tmp.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish +
                                                  lVar19 + *local_f8 * lVar18 + 1);
                      dVar25 = dVar25 + (double)*(byte *)(*local_178 * lVar18 + local_1b0 + 1 +
                                                         lVar19);
                      lVar19 = lVar19 + 1;
                    } while (lVar19 < (int)uVar20);
                  }
                  bVar6 = lVar18 < lVar17;
                  lVar18 = lVar18 + 1;
                } while (bVar6);
              }
              dVar28 = 0.0;
              dVar32 = 0.0;
              if (local_34 <= iVar7) {
                dVar31 = 0.0;
                lVar18 = lVar16;
                do {
                  if (iVar22 <= (int)uVar20) {
                    lVar19 = lVar1;
                    do {
                      dVar29 = (double)*(byte *)((long)tmp.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish +
                                                lVar19 + *local_f8 * lVar18 + 1) - dVar27 / dVar26;
                      dVar28 = dVar28 + dVar29 * dVar29;
                      dVar30 = (double)*(byte *)(*local_178 * lVar18 + local_1b0 + 1 + lVar19) -
                               dVar25 / dVar26;
                      dVar32 = dVar32 + dVar30 * dVar30;
                      dVar31 = dVar31 + dVar29 * dVar30;
                      lVar19 = lVar19 + 1;
                    } while (lVar19 < (int)uVar20);
                  }
                  bVar6 = lVar18 < lVar17;
                  lVar18 = lVar18 + 1;
                } while (bVar6);
              }
            }
            dVar28 = dVar28 / dVar26;
            if (dVar28 < 0.0) {
              dVar28 = sqrt(dVar28);
            }
            else {
              dVar28 = SQRT(dVar28);
            }
            dVar32 = dVar32 / dVar26;
            if (dVar32 < 0.0) {
              dVar32 = sqrt(dVar32);
            }
            else {
              dVar32 = SQRT(dVar32);
            }
            dVar26 = ((dVar31 / dVar26) / (dVar28 * dVar32)) / dVar26;
            pdVar5 = pvStack_a8[uVar14].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar2 = pdVar5 + uVar15;
            if (*pdVar2 <= dVar26 && dVar26 != *pdVar2) {
              pdVar5[uVar15] = dVar26;
              *(char *)((long)local_278 + uVar15 + *local_240 * uVar14) = (char)lVar23 * '\x03';
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar4);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar13);
    }
    cv::Mat::~Mat((Mat *)local_140);
    lVar23 = lVar23 + 1;
    uVar21 = uVar21 - 1;
  } while (lVar23 != 0x50);
  cv::Mat::Mat(in1,(Mat *)auStack_288);
LAB_00104789:
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&pvStack_a8);
  cv::Mat::~Mat((Mat *)auStack_288);
  cv::Mat::~Mat(local_1c0);
  cv::Mat::~Mat(local_220);
  return in1;
}

Assistant:

Mat
ncc(Mat in1, Mat in2, string type, bool add_constant=false)
{
    int width = in1.size().width;
    int height = in1.size().height;
    int max_offset = 79;
    int kernel_size = 3; // window size

    Mat left = bgr_to_grey(in1);
    Mat right = bgr_to_grey(in2);

    if (add_constant)
    {
        right += 10;
    }

    Mat depth(height, width, 0);
    vector< vector<double> > max_ncc; // store max NCC value

    for (int i = 0; i < height; ++i)
    {
        vector<double> tmp(width, -2);
        max_ncc.push_back(tmp);
    }

    for (int offset = 1; offset <= max_offset; offset++)
    {
        Mat tmp(height, width, 0);
        // shift image depend on type to save calculation time
        if (type == "left")
        {
            for (int y = 0; y < height; y++)
            {
                for (int x = 0; x < offset; x++)
                {
                    tmp.at<uchar>(y, x) = right.at<uchar>(y, x);
                }

                for (int x = offset; x < width; x++)
                {
                    tmp.at<uchar>(y, x) = right.at<uchar>(y, x - offset);
                }
            }
        }
        else if (type == "right")
        {
            for (int y = 0; y < height; y++)
            {
                for (int x = 0; x < width - offset; x++)
                {
                    tmp.at<uchar>(y, x) = left.at<uchar>(y, x + offset);
                }

                for (int x = width - offset; x < width; x++)
                {
                    tmp.at<uchar>(y, x) = left.at<uchar>(y, x);
                }
            }
        }
        else
        {
            Mat tmp(0, 0, 0);
            return tmp;
        }

        // calculate each pixel's NCC value
        for (int y = 0; y < height; y++)
        {
            for (int x = 0; x < width; x++)
            {
                int start_x = max(0, x - kernel_size);
                int start_y = max(0, y - kernel_size);
                int end_x = min(width - 1, x + kernel_size);
                int end_y = min(height - 1, y + kernel_size);
                double n = (end_y - start_y) * (end_x - start_x);
                double res_ncc = 0;

                if (type == "left")
                {
                    double left_mean = 0, right_mean = 0;
                    double left_std = 0, right_std = 0;
                    double numerator = 0;

                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            left_mean += left.at<uchar>(i, j);
                            right_mean += tmp.at<uchar>(i, j);
                        }
                    }

                    left_mean /= n;
                    right_mean /= n;

                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            left_std += pow(left.at<uchar>(i, j) - left_mean, 2);
                            right_std += pow(tmp.at<uchar>(i, j) - right_mean, 2);
                            numerator += (left.at<uchar>(i, j) - left_mean) * (tmp.at<uchar>(i, j) - right_mean);
                        }
                    }

                    numerator /= n;
                    left_std /= n;
                    right_std /= n;
                    res_ncc = numerator / (sqrt(left_std) * sqrt(right_std)) / n;
                }
                else
                {
                    double left_mean = 0, right_mean = 0;
                    double left_std = 0, right_std = 0;
                    double numerator = 0;

                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            left_mean += tmp.at<uchar>(i, j);
                            right_mean += right.at<uchar>(i, j);
                        }
                    }

                    left_mean /= n;
                    right_mean /= n;

                    for (int i = start_y; i <= end_y; i++)
                    {
                        for (int j = start_x; j <= end_x; j++)
                        {
                            left_std += pow(tmp.at<uchar>(i, j) - left_mean, 2);
                            right_std += pow(right.at<uchar>(i, j) - right_mean, 2);
                            numerator += (tmp.at<uchar>(i, j) - left_mean) * (right.at<uchar>(i, j) - right_mean);
                        }
                    }

                    numerator /= n;
                    left_std /= n;
                    right_std /= n;
                    res_ncc = numerator / (sqrt(left_std) * sqrt(right_std)) / n;
                }

                // greater NCC value found
                if (res_ncc > max_ncc[y][x])
                {
                    max_ncc[y][x] = res_ncc;
                    // for better visualization
                    depth.at<uchar>(y, x) = (uchar)(offset * 3);
                }
            }
        }
    }

    return depth;
}